

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

var __thiscall
cs::invoke<cs_impl::any_const&,cs_impl::any_const&>(cs *this,var *func,any *_args,any *_args_1)

{
  bool bVar1;
  type_info *ptVar2;
  callable *pcVar3;
  object_method *poVar4;
  runtime_error *this_00;
  long lVar5;
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  allocator_type local_59;
  any local_58;
  proxy *local_50;
  proxy *local_48;
  vector args;
  
  ptVar2 = cs_impl::any::type(func);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&callable::typeinfo);
  if (bVar1) {
    local_58 = (any)_args->mDat;
    if (local_58.mDat != (proxy *)0x0) {
      (local_58.mDat)->refcount = (local_58.mDat)->refcount + 1;
    }
    local_50 = _args_1->mDat;
    if (local_50 != (proxy *)0x0) {
      local_50->refcount = local_50->refcount + 1;
    }
    __l._M_len = 2;
    __l._M_array = &local_58;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args,__l,&local_59);
    lVar5 = 8;
    do {
      cs_impl::any::recycle((any *)((long)&local_58.mDat + lVar5));
      lVar5 = lVar5 + -8;
    } while (lVar5 != -8);
    pcVar3 = cs_impl::any::const_val<cs::callable>(func);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar3);
  }
  else {
    ptVar2 = cs_impl::any::type(func);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&object_method::typeinfo);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&args,"Invoke non-callable object.",(allocator *)&local_58);
      runtime_error::runtime_error(this_00,(string *)&args);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    poVar4 = cs_impl::any::const_val<cs::object_method>(func);
    local_58.mDat = (poVar4->object).mDat;
    if (local_58.mDat != (proxy *)0x0) {
      (local_58.mDat)->refcount = (local_58.mDat)->refcount + 1;
    }
    local_50 = _args->mDat;
    if (local_50 != (proxy *)0x0) {
      local_50->refcount = local_50->refcount + 1;
    }
    local_48 = _args_1->mDat;
    if (local_48 != (proxy *)0x0) {
      local_48->refcount = local_48->refcount + 1;
    }
    __l_00._M_len = 3;
    __l_00._M_array = &local_58;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&args,__l_00,&local_59);
    lVar5 = 0x10;
    do {
      cs_impl::any::recycle((any *)((long)&local_58.mDat + lVar5));
      lVar5 = lVar5 + -8;
    } while (lVar5 != -8);
    pcVar3 = cs_impl::any::const_val<cs::callable>(&poVar4->callable);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar3);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args);
  return (var)(proxy *)this;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}